

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall
SQVM::PLOCAL_INC(SQVM *this,SQInteger op,SQObjectPtr *target,SQObjectPtr *a,SQObjectPtr *incr)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQFloat SVar4;
  undefined4 uVar5;
  SQObjectFlags SVar6;
  undefined3 uVar7;
  undefined8 uVar8;
  bool bVar9;
  SQObjectPtr trg;
  SQObject local_28;
  
  local_28._unVal.pTable = (SQTable *)0x0;
  local_28._type = OT_NULL;
  local_28._flags = '\0';
  local_28._5_3_ = 0;
  bVar9 = ARITH_OP(this,op,(SQObjectPtr *)&local_28,a,incr);
  if (bVar9) {
    SVar2 = (target->super_SQObject)._type;
    pSVar3 = (target->super_SQObject)._unVal.pTable;
    SVar6 = (a->super_SQObject)._flags;
    uVar7 = *(undefined3 *)&(a->super_SQObject).field_0x5;
    SVar4 = (a->super_SQObject)._unVal.fFloat;
    uVar5 = *(undefined4 *)((long)&(a->super_SQObject)._unVal + 4);
    (target->super_SQObject)._type = (a->super_SQObject)._type;
    (target->super_SQObject)._flags = SVar6;
    *(undefined3 *)&(target->super_SQObject).field_0x5 = uVar7;
    (target->super_SQObject)._unVal.fFloat = SVar4;
    *(undefined4 *)((long)&(target->super_SQObject)._unVal + 4) = uVar5;
    if (((target->super_SQObject)._type & 0x8000000) != 0) {
      pSVar1 = &(((target->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    uVar8 = local_28._0_8_;
    SVar2 = (a->super_SQObject)._type;
    pSVar3 = (a->super_SQObject)._unVal.pTable;
    (a->super_SQObject)._type = local_28._type;
    (a->super_SQObject)._flags = local_28._flags;
    *(undefined3 *)&(a->super_SQObject).field_0x5 = local_28._5_3_;
    (a->super_SQObject)._unVal.fFloat = local_28._unVal.fFloat;
    *(undefined4 *)((long)&(a->super_SQObject)._unVal + 4) = local_28._unVal.nInteger._4_4_;
    if (((a->super_SQObject)._type & 0x8000000) != 0) {
      pSVar1 = &(((a->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    local_28._0_8_ = uVar8;
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_28);
  return bVar9;
}

Assistant:

bool SQVM::PLOCAL_INC(SQInteger op,SQObjectPtr &target, SQObjectPtr &a, SQObjectPtr &incr)
{
    SQObjectPtr trg;
    _RET_ON_FAIL(ARITH_OP( op , trg, a, incr));
    target = a;
    a = trg;
    return true;
}